

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextNewFrameUpdateDocking(ImGuiContext *ctx)

{
  ImVector<ImGuiDockRequest> *this;
  ImGuiWindow *pIVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiStoragePair *pIVar4;
  int n;
  int iVar5;
  ImGuiContext *g;
  
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    return;
  }
  ctx->HoveredDockNode = (ImGuiDockNode *)0x0;
  pIVar1 = ctx->HoveredWindowUnderMovingWindow;
  if (pIVar1 != (ImGuiWindow *)0x0) {
    if (pIVar1->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      pIVar2 = pIVar1->RootWindow->DockNode;
      if (pIVar2 == (ImGuiDockNode *)0x0) goto LAB_001494f8;
    }
    else {
      pIVar2 = DockNodeTreeFindVisibleNodeByPos(pIVar1->DockNodeAsHost,(ctx->IO).MousePos);
    }
    ctx->HoveredDockNode = pIVar2;
  }
LAB_001494f8:
  this = &(ctx->DockContext).Requests;
  for (iVar5 = 0; iVar5 < this->Size; iVar5 = iVar5 + 1) {
    pIVar3 = ImVector<ImGuiDockRequest>::operator[](this,iVar5);
    if (pIVar3->Type == ImGuiDockRequestType_Dock) {
      pIVar3 = ImVector<ImGuiDockRequest>::operator[](this,iVar5);
      DockContextProcessDock(ctx,pIVar3);
    }
  }
  ImVector<ImGuiDockRequest>::resize(this,0);
  for (iVar5 = 0; iVar5 < (ctx->DockContext).Nodes.Data.Size; iVar5 = iVar5 + 1) {
    pIVar4 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,iVar5);
    pIVar2 = (ImGuiDockNode *)(pIVar4->field_1).val_p;
    if (((pIVar2 != (ImGuiDockNode *)0x0) && (pIVar2->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar2->MergedFlags & 0x400U) == 0)) {
      DockNodeUpdate(pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextNewFrameUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // [DEBUG] Store hovered dock node.
    // We could in theory use DockNodeTreeFindVisibleNodeByPos() on the root host dock node, but using ->DockNode is a good shortcut.
    // Note this is mostly a debug thing and isn't actually used for docking target, because docking involve more detailed filtering.
    g.HoveredDockNode = NULL;
    if (ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow)
    {
        if (hovered_window->DockNodeAsHost)
            g.HoveredDockNode = DockNodeTreeFindVisibleNodeByPos(hovered_window->DockNodeAsHost, g.IO.MousePos);
        else if (hovered_window->RootWindow->DockNode)
            g.HoveredDockNode = hovered_window->RootWindow->DockNode;
    }

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}